

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3InitCallback(void *pInit,int argc,char **argv,char **NotUsed)

{
  Schema *pSVar1;
  char *zObj;
  sqlite3 *pData_00;
  int iVar2;
  char *zExtra;
  Index *pIVar3;
  Index *pIndex;
  sqlite3_stmt *pStmt;
  uint local_48;
  int iStack_44;
  u8 saved_iDb;
  int rc;
  int iDb;
  sqlite3 *db;
  InitData *pData;
  char **NotUsed_local;
  char **argv_local;
  void *pvStack_18;
  int argc_local;
  void *pInit_local;
  
  _rc = *pInit;
  iStack_44 = *(int *)((long)pInit + 0x10);
  pSVar1 = _rc->aDb[iStack_44].pSchema;
  pSVar1->schemaFlags = pSVar1->schemaFlags & 0xfffb;
  db = (sqlite3 *)pInit;
  pData = (InitData *)NotUsed;
  NotUsed_local = argv;
  argv_local._4_4_ = argc;
  pvStack_18 = pInit;
  if (_rc->mallocFailed == '\0') {
    if (argv == (char **)0x0) {
      pInit_local._4_4_ = 0;
    }
    else {
      if (argv[1] == (char *)0x0) {
        corruptSchema((InitData *)pInit,*argv,(char *)0x0);
      }
      else {
        iVar2 = sqlite3_strnicmp(argv[2],"create ",7);
        if (iVar2 == 0) {
          pStmt._7_1_ = (_rc->init).iDb;
          (_rc->init).iDb = (u8)iStack_44;
          iVar2 = sqlite3Atoi(NotUsed_local[1]);
          (_rc->init).newTnum = iVar2;
          (_rc->init).orphanTrigger = '\0';
          sqlite3_prepare(_rc,NotUsed_local[2],-1,(sqlite3_stmt **)&pIndex,(char **)0x0);
          pData_00 = db;
          local_48 = _rc->errCode;
          (_rc->init).iDb = pStmt._7_1_;
          if ((local_48 != 0) && ((_rc->init).orphanTrigger == '\0')) {
            *(uint *)((long)&db->pDfltColl + 4) = local_48;
            if (local_48 == 7) {
              sqlite3OomFault(_rc);
            }
            else if ((local_48 != 9) && ((local_48 & 0xff) != 6)) {
              zObj = *NotUsed_local;
              zExtra = sqlite3_errmsg(_rc);
              corruptSchema((InitData *)pData_00,zObj,zExtra);
            }
          }
          sqlite3_finalize((sqlite3_stmt *)pIndex);
        }
        else if ((*NotUsed_local == (char *)0x0) ||
                ((NotUsed_local[2] != (char *)0x0 && (*NotUsed_local[2] != '\0')))) {
          corruptSchema((InitData *)db,*NotUsed_local,(char *)0x0);
        }
        else {
          pIVar3 = sqlite3FindIndex(_rc,*NotUsed_local,_rc->aDb[iStack_44].zDbSName);
          if ((pIVar3 != (Index *)0x0) &&
             (iVar2 = sqlite3GetInt32(NotUsed_local[1],&pIVar3->tnum), iVar2 == 0)) {
            corruptSchema((InitData *)db,*NotUsed_local,"invalid rootpage");
          }
        }
      }
      pInit_local._4_4_ = 0;
    }
  }
  else {
    corruptSchema((InitData *)pInit,*argv,(char *)0x0);
    pInit_local._4_4_ = 1;
  }
  return pInit_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3InitCallback(void *pInit, int argc, char **argv, char **NotUsed){
  InitData *pData = (InitData*)pInit;
  sqlite3 *db = pData->db;
  int iDb = pData->iDb;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);
  assert( sqlite3_mutex_held(db->mutex) );
  DbClearProperty(db, iDb, DB_Empty);
  if( db->mallocFailed ){
    corruptSchema(pData, argv[0], 0);
    return 1;
  }

  assert( iDb>=0 && iDb<db->nDb );
  if( argv==0 ) return 0;   /* Might happen if EMPTY_RESULT_CALLBACKS are on */
  if( argv[1]==0 ){
    corruptSchema(pData, argv[0], 0);
  }else if( sqlite3_strnicmp(argv[2],"create ",7)==0 ){
    /* Call the parser to process a CREATE TABLE, INDEX or VIEW.
    ** But because db->init.busy is set to 1, no VDBE code is generated
    ** or executed.  All the parser does is build the internal data
    ** structures that describe the table, index, or view.
    */
    int rc;
    u8 saved_iDb = db->init.iDb;
    sqlite3_stmt *pStmt;
    TESTONLY(int rcp);            /* Return code from sqlite3_prepare() */

    assert( db->init.busy );
    db->init.iDb = iDb;
    db->init.newTnum = sqlite3Atoi(argv[1]);
    db->init.orphanTrigger = 0;
    TESTONLY(rcp = ) sqlite3_prepare(db, argv[2], -1, &pStmt, 0);
    rc = db->errCode;
    assert( (rc&0xFF)==(rcp&0xFF) );
    db->init.iDb = saved_iDb;
    assert( saved_iDb==0 || (db->flags & SQLITE_Vacuum)!=0 );
    if( SQLITE_OK!=rc ){
      if( db->init.orphanTrigger ){
        assert( iDb==1 );
      }else{
        pData->rc = rc;
        if( rc==SQLITE_NOMEM ){
          sqlite3OomFault(db);
        }else if( rc!=SQLITE_INTERRUPT && (rc&0xFF)!=SQLITE_LOCKED ){
          corruptSchema(pData, argv[0], sqlite3_errmsg(db));
        }
      }
    }
    sqlite3_finalize(pStmt);
  }else if( argv[0]==0 || (argv[2]!=0 && argv[2][0]!=0) ){
    corruptSchema(pData, argv[0], 0);
  }else{
    /* If the SQL column is blank it means this is an index that
    ** was created to be the PRIMARY KEY or to fulfill a UNIQUE
    ** constraint for a CREATE TABLE.  The index should have already
    ** been created when we processed the CREATE TABLE.  All we have
    ** to do here is record the root page number for that index.
    */
    Index *pIndex;
    pIndex = sqlite3FindIndex(db, argv[0], db->aDb[iDb].zDbSName);
    if( pIndex==0 ){
      /* This can occur if there exists an index on a TEMP table which
      ** has the same name as another index on a permanent index.  Since
      ** the permanent table is hidden by the TEMP table, we can also
      ** safely ignore the index on the permanent table.
      */
      /* Do Nothing */;
    }else if( sqlite3GetInt32(argv[1], &pIndex->tnum)==0 ){
      corruptSchema(pData, argv[0], "invalid rootpage");
    }
  }
  return 0;
}